

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<std::__cxx11::string_const&,char_const(&)[13],unsigned_int_const&,char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          char (*ts) [13],uint *ts_1,char **ts_2,char (*ts_3) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,char (*ts_5) [2])

{
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,t);
  this->statement_count = this->statement_count + 1;
  statement_inner<char_const(&)[13],unsigned_int_const&,char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}